

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

void __thiscall gguf_kv::cast(gguf_kv *this,gguf_type new_type)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  if (GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var2 = GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)new_type <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)new_type];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != &GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header) &&
       ((int)p_Var1[1]._M_color <= (int)new_type)) {
      p_Var2 = p_Var1[1]._M_parent;
      goto LAB_00141379;
    }
  }
  p_Var2 = (_Base_ptr)0x0;
LAB_00141379:
  if ((ulong)((long)(this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) % (ulong)p_Var2 == 0) {
    this->type = new_type;
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0xc4,
             "GGML_ASSERT(%s) failed","data.size() % new_type_size == 0");
}

Assistant:

void cast(const enum gguf_type new_type) {
        const size_t new_type_size = gguf_type_size(new_type);
        GGML_ASSERT(data.size() % new_type_size == 0);
        type = new_type;
    }